

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall crnlib::mip_level::can_unflip_without_unpacking(mip_level *this)

{
  dxt_image *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  this_00 = this->m_pDXTImage;
  bVar3 = this->m_pImage != (image_u8 *)0x0 || this_00 != (dxt_image *)0x0;
  if (this_00 != (dxt_image *)0x0) {
    bVar1 = true;
    if ((this->m_orient_flags & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
      bVar1 = dxt_image::can_flip(this_00,0);
    }
    bVar3 = bVar1;
    if ((this->m_orient_flags & cOrientationFlagYFlipped) != cDefaultOrientationFlags) {
      bVar2 = dxt_image::can_flip(this->m_pDXTImage,1);
      bVar3 = false;
      if (bVar2) {
        bVar3 = bVar1;
      }
    }
  }
  return bVar3;
}

Assistant:

bool mip_level::can_unflip_without_unpacking() const {
  if (!is_valid())
    return false;

  if (!is_packed())
    return true;

  bool can_unflip = true;
  if (m_orient_flags & cOrientationFlagXFlipped) {
    if (!m_pDXTImage->can_flip(0))
      can_unflip = false;
  }
  if (m_orient_flags & cOrientationFlagYFlipped) {
    if (!m_pDXTImage->can_flip(1))
      can_unflip = false;
  }

  return can_unflip;
}